

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderXFB.cpp
# Opt level: O0

IterateResult __thiscall glcts::TessellationShaderXFB::iterate(TessellationShaderXFB *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  NotSupportedError *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  TestError *pTVar8;
  void *__s;
  float fVar9;
  GLuint local_6d4;
  GLuint local_6bc;
  GLuint local_6a4;
  bool local_65e;
  MessageBuilder local_630;
  float *local_4b0;
  GLfloat *captured_data_ptr;
  GLfloat *expected_data_ptr;
  GLfloat GStack_498;
  int n_value;
  GLfloat expected_vs_data [4];
  GLfloat expected_te_data [4];
  GLfloat expected_tc_data [4];
  GLfloat expected_gs_data [4];
  GLfloat epsilon;
  GLfloat *result_ptr;
  GLint err;
  bool didBeginXFBFail;
  char *local_438;
  char *local_430;
  MessageBuilder local_428;
  int local_2a4;
  char *pcStack_2a0;
  GLint link_status;
  char *local_298;
  char *local_290;
  MessageBuilder local_288;
  int local_104;
  reference p_Stack_100;
  GLint validate_status;
  _test_descriptor *test;
  __normal_iterator<glcts::TessellationShaderXFB::_test_descriptor_*,_std::vector<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>_>
  local_f0;
  __normal_iterator<const_glcts::TessellationShaderXFB::_test_descriptor_*,_std::vector<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>_>
  local_e8;
  _tests_const_iterator test_iterator;
  bool use_pipeline_object;
  int n_iteration;
  Functions *gl;
  string local_c8;
  ApiType local_a4;
  undefined1 local_a0 [8];
  _tests tests;
  _test_descriptor test_3;
  _test_descriptor test_2;
  _test_descriptor test_1;
  allocator<char> local_31;
  string local_30;
  TessellationShaderXFB *local_10;
  TessellationShaderXFB *this_local;
  long lVar5;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Tessellation shader functionality not supported, skipping",
               &local_31);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initTest(this);
  _test_descriptor::_test_descriptor((_test_descriptor *)&test_2.tf_mode);
  _test_descriptor::_test_descriptor((_test_descriptor *)&test_3.tf_mode);
  _test_descriptor::_test_descriptor
            ((_test_descriptor *)
             ((long)&tests.
                     super__Vector_base<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::
  vector<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
  ::vector((vector<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
            *)local_a0);
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) != 0) {
    test_2.tf_mode = (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER;
    test_2.use_gs = true;
    test_2.use_tc = false;
    test_2.use_te = false;
    test_2._19_1_ = 0;
    std::
    vector<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
    ::push_back((vector<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
                 *)local_a0,(value_type *)&test_2.tf_mode);
  }
  test_3.tf_mode = (this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER;
  test_3.use_gs = true;
  test_3.use_tc = false;
  test_3.use_te = false;
  test_3._19_1_ = 0;
  test_2.expected_data_source._0_1_ = 0;
  test_2.expected_data_source._1_1_ = 0;
  test_2.expected_n_values = 0;
  test_2.should_draw_call_fail = false;
  test_2.requires_pipeline = true;
  test_2._10_1_ = 1;
  std::
  vector<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
  ::push_back((vector<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
               *)local_a0,(value_type *)&test_3.tf_mode);
  tests.
  super__Vector_base<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       (this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER;
  gl._6_1_ = 0;
  gl._5_1_ = 0;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  local_a4.m_bits = (*pRVar4->_vptr_RenderContext[2])();
  bVar1 = glu::isContextTypeES((ContextType)local_a4.m_bits);
  local_65e = false;
  if (!bVar1) {
    std::allocator<char>::allocator();
    gl._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"GL_NV_gpu_shader5",(allocator<char> *)((long)&gl + 7));
    gl._5_1_ = 1;
    local_65e = TestCaseBase::isExtensionSupported(&this->super_TestCaseBase,&local_c8);
  }
  if ((gl._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c8);
  }
  if ((gl._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&gl + 7));
  }
  if (local_65e != false) {
    test_3.expected_n_values = (this->super_TestCaseBase).m_glExtTokens.PATCHES;
  }
  else {
    test_3.expected_n_values = 0;
  }
  test_3.expected_data_source._0_1_ = local_65e == false;
  test_3.expected_data_source._1_1_ = 1;
  test_3.should_draw_call_fail = false;
  test_3.requires_pipeline = true;
  test_3._10_1_ = 0;
  std::
  vector<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
  ::push_back((vector<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
               *)local_a0,
              (value_type *)
              ((long)&tests.
                      super__Vector_base<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar5 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,1);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glPatchParameteriEXT() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                  ,0x281);
  test_iterator._M_current._4_4_ = 0;
  do {
    if (1 < test_iterator._M_current._4_4_) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      std::
      vector<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
      ::~vector((vector<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
                 *)local_a0);
      return STOP;
    }
    test_iterator._M_current._3_1_ = test_iterator._M_current._4_4_ == 1;
    if ((bool)test_iterator._M_current._3_1_) {
      (**(code **)(lVar5 + 0x98))(this->m_pipeline_id);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glBindProgramPipeline() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                      ,0x291);
      (**(code **)(lVar5 + 0x1680))(0);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glUseProgram() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                      ,0x294);
    }
    else {
      (**(code **)(lVar5 + 0x98))(0);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glBindProgramPipeline() failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                      ,0x299);
    }
    local_f0._M_current =
         (_test_descriptor *)
         std::
         vector<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
         ::begin((vector<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
                  *)local_a0);
    __gnu_cxx::
    __normal_iterator<glcts::TessellationShaderXFB::_test_descriptor_const*,std::vector<glcts::TessellationShaderXFB::_test_descriptor,std::allocator<glcts::TessellationShaderXFB::_test_descriptor>>>
    ::__normal_iterator<glcts::TessellationShaderXFB::_test_descriptor*>
              ((__normal_iterator<glcts::TessellationShaderXFB::_test_descriptor_const*,std::vector<glcts::TessellationShaderXFB::_test_descriptor,std::allocator<glcts::TessellationShaderXFB::_test_descriptor>>>
                *)&local_e8,&local_f0);
    while( true ) {
      test = (_test_descriptor *)
             std::
             vector<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
             ::end((vector<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>
                    *)local_a0);
      bVar1 = __gnu_cxx::operator!=
                        (&local_e8,
                         (__normal_iterator<glcts::TessellationShaderXFB::_test_descriptor_*,_std::vector<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>_>
                          *)&test);
      if (!bVar1) break;
      p_Stack_100 = __gnu_cxx::
                    __normal_iterator<const_glcts::TessellationShaderXFB::_test_descriptor_*,_std::vector<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>_>
                    ::operator*(&local_e8);
      if ((test_iterator._M_current._3_1_ & 1) == 0) {
        if ((p_Stack_100->requires_pipeline & 1U) == 0) {
          if ((p_Stack_100->use_gs & 1U) != 0) {
            (**(code **)(lVar5 + 0x10))(this->m_po_id,this->m_gs_id);
            dVar3 = (**(code **)(lVar5 + 0x800))();
            glu::checkError(dVar3,"Could not attach geometry shader",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                            ,0x2d7);
          }
          if ((p_Stack_100->use_tc & 1U) != 0) {
            (**(code **)(lVar5 + 0x10))(this->m_po_id,this->m_tc_id);
            dVar3 = (**(code **)(lVar5 + 0x800))();
            glu::checkError(dVar3,"Could not attach tessellation control shader",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                            ,0x2dd);
          }
          if ((p_Stack_100->use_te & 1U) != 0) {
            (**(code **)(lVar5 + 0x10))(this->m_po_id,this->m_te_id);
            dVar3 = (**(code **)(lVar5 + 0x800))();
            glu::checkError(dVar3,"Could not attach tessellation evaluation shader",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                            ,0x2e3);
          }
          (**(code **)(lVar5 + 0xce8))(this->m_po_id);
          dVar3 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar3,"Could not link program object",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x2e8);
          local_2a4 = 0;
          (**(code **)(lVar5 + 0x9d8))(this->m_po_id,0x8b82,&local_2a4);
          dVar3 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar3,"glGetProgramiv() failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x2ee);
          if (local_2a4 != 1) {
            pTVar6 = tcu::TestContext::getLog
                               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_428,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar7 = tcu::MessageBuilder::operator<<
                               (&local_428,(char (*) [33])"A program object consisting of: ");
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [19])"[fragment shader] ");
            local_430 = "";
            if ((p_Stack_100->use_gs & 1U) != 0) {
              local_430 = "[geometry shader] ";
            }
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_430);
            local_438 = "";
            if ((p_Stack_100->use_tc & 1U) != 0) {
              local_438 = "[tessellation control shader] ";
            }
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_438);
            _err = "";
            if ((p_Stack_100->use_te & 1U) != 0) {
              _err = "[tessellation evaluation shader] ";
            }
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char **)&err);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [17])"[vertex shader] ");
            pMVar7 = tcu::MessageBuilder::operator<<
                               (pMVar7,(char (*) [57])
                                       "failed to link, even though it should link successfully.");
            tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_428);
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,"Program linking failed, even though the shader combination was valid"
                       ,(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                       ,0x2fa);
            __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          (**(code **)(lVar5 + 0x1680))(this->m_po_id);
          dVar3 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar3,"glUseProgram() failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x2fe);
          goto LAB_01543081;
        }
      }
      else {
        if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) != 0) {
          if ((p_Stack_100->use_gs & 1U) == 0) {
            local_6a4 = 0;
          }
          else {
            local_6a4 = this->m_gs_program_id;
          }
          (**(code **)(lVar5 + 0x1688))
                    (this->m_pipeline_id,
                     (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER_BIT,local_6a4);
          dVar3 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar3,"glUseProgramStages() failed for GL_GEOMETRY_SHADER_BIT_EXT",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x2aa);
        }
        if ((p_Stack_100->use_tc & 1U) == 0) {
          local_6bc = 0;
        }
        else {
          local_6bc = this->m_tc_program_id;
        }
        (**(code **)(lVar5 + 0x1688))
                  (this->m_pipeline_id,
                   (this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER_BIT,local_6bc);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"glUseProgramStages() failed for GL_TESS_CONTROL_SHADER_BIT_EXT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                        ,0x2af);
        if ((p_Stack_100->use_te & 1U) == 0) {
          local_6d4 = 0;
        }
        else {
          local_6d4 = this->m_te_program_id;
        }
        (**(code **)(lVar5 + 0x1688))
                  (this->m_pipeline_id,
                   (this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER_BIT,local_6d4);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"glUseProgramStages() failed for GL_TESS_EVALUATION_SHADER_BIT_EXT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                        ,0x2b3);
        (**(code **)(lVar5 + 0x1698))(this->m_pipeline_id);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"glValidateProgramPipeline() failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                        ,0x2b7);
        local_104 = 0;
        (**(code **)(lVar5 + 0x9a0))(this->m_pipeline_id,0x8b83,&local_104);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"glGetProgramPipelineiv() failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                        ,0x2bd);
        if ((local_104 == 0) && ((p_Stack_100->should_draw_call_fail & 1U) == 0)) {
          pTVar6 = tcu::TestContext::getLog
                             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_288,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar7 = tcu::MessageBuilder::operator<<
                             (&local_288,(char (*) [34])"A pipeline object consisting of: ");
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [18])"[fragment stage] ");
          local_290 = "";
          if ((p_Stack_100->use_gs & 1U) != 0) {
            local_290 = "[geometry stage] ";
          }
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_290);
          local_298 = "";
          if ((p_Stack_100->use_tc & 1U) != 0) {
            local_298 = "[tessellation control stage] ";
          }
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_298);
          pcStack_2a0 = "";
          if ((p_Stack_100->use_te & 1U) != 0) {
            pcStack_2a0 = "[tessellation evaluation stage] ";
          }
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&stack0xfffffffffffffd60);
          pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [16])"[vertex stage] ");
          pMVar7 = tcu::MessageBuilder::operator<<
                             (pMVar7,(char (*) [55])
                                     "was not validated successfully, even though it should.");
          tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_288);
          pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar8,
                     "Pipeline object is considered invalid, even though the stage combination is valid"
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                     ,0x2c8);
          __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
LAB_01543081:
        (**(code **)(lVar5 + 0x5e0))(0x8c89);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"glEnable(GL_RASTERIZER_DISCARD) failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                        ,0x303);
        (**(code **)(lVar5 + 0x30))(p_Stack_100->tf_mode);
        bVar1 = false;
        if ((p_Stack_100->should_draw_call_fail & 1U) == 0) {
          dVar3 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar3,"glBeginTransformFeedback(GL_POINTS) failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x30a);
        }
        else {
          iVar2 = (**(code **)(lVar5 + 0x800))();
          if (iVar2 == 0x502) {
            bVar1 = true;
          }
          else if (iVar2 != 0) {
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,
                       "Unexpected GL error in a beginTransformFeedback made on the program pipeline whoseprogram closest to TFB has no output varying specified"
                       ,(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                       ,0x31a);
            __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
        }
        (**(code **)(lVar5 + 0x538))((this->super_TestCaseBase).m_glExtTokens.PATCHES,0,1);
        if ((p_Stack_100->should_draw_call_fail & 1U) == 0) {
          dVar3 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar3,"glDrawArrays() failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x323);
        }
        else {
          iVar2 = (**(code **)(lVar5 + 0x800))();
          if (iVar2 != 0x502) {
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,
                       "A draw call made using a program object lacking TES stage has not generated a GL_INVALID_OPERATION as specified"
                       ,(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                       ,0x32a);
            __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
        }
        (**(code **)(lVar5 + 0x638))();
        if (bVar1) {
          iVar2 = (**(code **)(lVar5 + 0x800))();
          if (iVar2 != 0x502) {
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,
                       "An endTransformFeedback made on inactive xfb has not generated a GL_INVALID_OPERATION as specified"
                       ,(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                       ,0x339);
            __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
        }
        else {
          dVar3 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar3,"glEndTransformFeedback() failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x332);
        }
        (**(code **)(lVar5 + 0x4e8))(0x8c89);
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"glDisable(GL_RASTERIZER_DISCARD) failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                        ,0x33e);
        if ((p_Stack_100->should_draw_call_fail & 1U) == 0) {
          __s = (void *)(**(code **)(lVar5 + 0xd00))
                                  (0x8c8e,0,(long)p_Stack_100->expected_n_values << 4,3);
          dVar3 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar3,"glMapBufferRange() failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x347);
          expected_tc_data[2] = 1.0;
          expected_tc_data[3] = 2.0;
          expected_te_data[2] = 2.0;
          expected_te_data[3] = 3.0;
          expected_tc_data[0] = 4.0;
          expected_tc_data[1] = 5.0;
          expected_vs_data[2] = 3.0;
          expected_vs_data[3] = 4.0;
          expected_te_data[0] = 5.0;
          expected_te_data[1] = 6.0;
          _GStack_498 = 0x40a0000040800000;
          expected_vs_data[0] = 6.0;
          expected_vs_data[1] = 7.0;
          for (expected_data_ptr._4_4_ = 0; expected_data_ptr._4_4_ < p_Stack_100->expected_n_values
              ; expected_data_ptr._4_4_ = expected_data_ptr._4_4_ + 1) {
            captured_data_ptr = (GLfloat *)0x0;
            local_4b0 = (float *)((long)__s + (long)(expected_data_ptr._4_4_ << 2) * 4);
            if (p_Stack_100->expected_data_source ==
                (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER) {
              captured_data_ptr = expected_tc_data + 2;
            }
            else if (p_Stack_100->expected_data_source ==
                     (this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER) {
              captured_data_ptr = expected_te_data + 2;
            }
            else if (p_Stack_100->expected_data_source ==
                     (this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER) {
              captured_data_ptr = expected_vs_data + 2;
            }
            else {
              if (p_Stack_100->expected_data_source != 0x8b31) {
                pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (pTVar8,"Unrecognized expected data source",(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                           ,0x367);
                __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
              }
              captured_data_ptr = &GStack_498;
            }
            fVar9 = de::abs<float>(*local_4b0 - *captured_data_ptr);
            if ((((1e-05 < fVar9) ||
                 (fVar9 = de::abs<float>(local_4b0[1] - captured_data_ptr[1]), 1e-05 < fVar9)) ||
                (fVar9 = de::abs<float>(local_4b0[2] - captured_data_ptr[2]), 1e-05 < fVar9)) ||
               (fVar9 = de::abs<float>(local_4b0[3] - captured_data_ptr[3]), 1e-05 < fVar9)) {
              pTVar6 = tcu::TestContext::getLog
                                 ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx
                                 );
              tcu::TestLog::operator<<
                        (&local_630,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar7 = tcu::MessageBuilder::operator<<(&local_630,(char (*) [15])"Captured data ");
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2afcbef);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_4b0);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_4b0 + 1);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_4b0 + 2);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_4b0 + 3);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2a85ff4);
              pMVar7 = tcu::MessageBuilder::operator<<
                                 (pMVar7,(char (*) [38])"is different from the expected value ");
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2afcbef);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,captured_data_ptr);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,captured_data_ptr + 1);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,captured_data_ptr + 2);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,captured_data_ptr + 3);
              pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2a85ff4);
              tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_630);
              pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar8,"Invalid data captured",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                         ,0x377);
              __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
          }
          memset(__s,0,(long)p_Stack_100->expected_n_values << 4);
          (**(code **)(lVar5 + 0x1670))(0x8c8e);
          dVar3 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar3,"glUnmapBuffer() failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                          ,0x37f);
        }
        if ((test_iterator._M_current._3_1_ & 1) == 0) {
          if ((p_Stack_100->use_gs & 1U) != 0) {
            (**(code **)(lVar5 + 0x4e0))(this->m_po_id,this->m_gs_id);
            dVar3 = (**(code **)(lVar5 + 0x800))();
            glu::checkError(dVar3,"Could not detach geometry shader",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                            ,0x389);
          }
          if ((p_Stack_100->use_tc & 1U) != 0) {
            (**(code **)(lVar5 + 0x4e0))(this->m_po_id,this->m_tc_id);
            dVar3 = (**(code **)(lVar5 + 0x800))();
            glu::checkError(dVar3,"Could not detach tessellation control shader",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                            ,0x38f);
          }
          if ((p_Stack_100->use_te & 1U) != 0) {
            (**(code **)(lVar5 + 0x4e0))(this->m_po_id,this->m_te_id);
            dVar3 = (**(code **)(lVar5 + 0x800))();
            glu::checkError(dVar3,"Could not detach tessellation evaluation shader",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderXFB.cpp"
                            ,0x395);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_glcts::TessellationShaderXFB::_test_descriptor_*,_std::vector<glcts::TessellationShaderXFB::_test_descriptor,_std::allocator<glcts::TessellationShaderXFB::_test_descriptor>_>_>
      ::operator++(&local_e8,0);
    }
    test_iterator._M_current._4_4_ = test_iterator._M_current._4_4_ + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderXFB::iterate(void)
{
	/* Do not execute if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	typedef std::vector<_test_descriptor> _tests;
	typedef _tests::const_iterator		  _tests_const_iterator;

	/* Initialize ES test objects */
	initTest();

	/* Describe test iterations */
	_test_descriptor test_1; /* vs+tc+te+gs */
	_test_descriptor test_2; /* vs+tc+te */
	_test_descriptor test_3; /* vs+tc */
	_tests			 tests;

	if (m_is_geometry_shader_extension_supported)
	{
		test_1.expected_data_source  = m_glExtTokens.GEOMETRY_SHADER;
		test_1.expected_n_values	 = 2;
		test_1.should_draw_call_fail = false;
		test_1.requires_pipeline	 = false;
		test_1.tf_mode				 = GL_POINTS;
		test_1.use_gs				 = true;
		test_1.use_tc				 = true;
		test_1.use_te				 = true;

		tests.push_back(test_1);
	}

	test_2.expected_data_source  = m_glExtTokens.TESS_EVALUATION_SHADER;
	test_2.expected_n_values	 = 2;
	test_2.should_draw_call_fail = false;
	test_2.requires_pipeline	 = false;
	test_2.tf_mode				 = GL_POINTS;
	test_2.use_gs				 = false;
	test_2.use_tc				 = true;
	test_2.use_te				 = true;

	tests.push_back(test_2);

	/* Note: This is a special negative case */
	test_3.expected_data_source = m_glExtTokens.TESS_CONTROL_SHADER;
	test_3.expected_n_values	= 4;
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()) && isExtensionSupported("GL_NV_gpu_shader5"))
	{
		test_3.should_draw_call_fail = false;
		test_3.tf_mode				 = m_glExtTokens.PATCHES;
	}
	else
	{
		test_3.should_draw_call_fail = true;
		test_3.tf_mode				 = GL_POINTS;
	}
	test_3.requires_pipeline = true;
	test_3.use_gs			 = false;
	test_3.use_tc			 = true;
	test_3.use_te			 = false;

	tests.push_back(test_3);

	/* Use only one vertex per patch */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 1);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() failed.");

	/* This test runs in two iterations:
	 *
	 * 1) Shaders are attached to a program object at the beginning of
	 *    each test. The test then executes. Once it's completed, the
	 *    shaders are detached from the program object;
	 * 2) A pipeline object is used instead of a program object.
	 */
	for (int n_iteration = 0; n_iteration < 2; ++n_iteration)
	{
		bool use_pipeline_object = (n_iteration == 1);

		if (use_pipeline_object)
		{
			gl.bindProgramPipeline(m_pipeline_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() failed.");

			gl.useProgram(0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed");
		}
		else
		{
			gl.bindProgramPipeline(0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindProgramPipeline() failed.");

			/* The program object will be shortly re-linked so defer the glUseProgram() call */
		}

		/* Iterate through all tests */
		for (_tests_const_iterator test_iterator = tests.begin(); test_iterator != tests.end(); test_iterator++)
		{
			const _test_descriptor& test = *test_iterator;

			if (use_pipeline_object)
			{
				/* Configure the pipeline object */
				if (m_is_geometry_shader_extension_supported)
				{
					gl.useProgramStages(m_pipeline_id, m_glExtTokens.GEOMETRY_SHADER_BIT,
										test.use_gs ? m_gs_program_id : 0);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() failed for GL_GEOMETRY_SHADER_BIT_EXT");
				}

				gl.useProgramStages(m_pipeline_id, m_glExtTokens.TESS_CONTROL_SHADER_BIT,
									test.use_tc ? m_tc_program_id : 0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() failed for GL_TESS_CONTROL_SHADER_BIT_EXT");

				gl.useProgramStages(m_pipeline_id, m_glExtTokens.TESS_EVALUATION_SHADER_BIT,
									test.use_te ? m_te_program_id : 0);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgramStages() failed for GL_TESS_EVALUATION_SHADER_BIT_EXT");

				/* Validate the pipeline object */
				gl.validateProgramPipeline(m_pipeline_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glValidateProgramPipeline() failed");

				/* Retrieve the validation result */
				glw::GLint validate_status = GL_FALSE;

				gl.getProgramPipelineiv(m_pipeline_id, GL_VALIDATE_STATUS, &validate_status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramPipelineiv() failed");

				if (validate_status == GL_FALSE && !test.should_draw_call_fail)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "A pipeline object consisting of: "
									   << "[fragment stage] " << ((test.use_gs) ? "[geometry stage] " : "")
									   << ((test.use_tc) ? "[tessellation control stage] " : "")
									   << ((test.use_te) ? "[tessellation evaluation stage] " : "") << "[vertex stage] "
									   << "was not validated successfully, even though it should."
									   << tcu::TestLog::EndMessage;

					TCU_FAIL("Pipeline object is considered invalid, even though the stage combination is valid");
				}
			}
			else
			{
				if (test.requires_pipeline)
				{
					continue;
				}

				/* Attach the shaders to the program object as described in
				 * the test descriptor */
				if (test.use_gs)
				{
					gl.attachShader(m_po_id, m_gs_id);
					GLU_EXPECT_NO_ERROR(gl.getError(), "Could not attach geometry shader");
				}

				if (test.use_tc)
				{
					gl.attachShader(m_po_id, m_tc_id);
					GLU_EXPECT_NO_ERROR(gl.getError(), "Could not attach tessellation control shader");
				}

				if (test.use_te)
				{
					gl.attachShader(m_po_id, m_te_id);
					GLU_EXPECT_NO_ERROR(gl.getError(), "Could not attach tessellation evaluation shader");
				}

				/* Link the program object */
				gl.linkProgram(m_po_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "Could not link program object");

				/* Has the linking succeeded? */
				glw::GLint link_status = GL_FALSE;

				gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() failed");

				if (link_status != GL_TRUE)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "A program object consisting of: "
									   << "[fragment shader] " << ((test.use_gs) ? "[geometry shader] " : "")
									   << ((test.use_tc) ? "[tessellation control shader] " : "")
									   << ((test.use_te) ? "[tessellation evaluation shader] " : "")
									   << "[vertex shader] "
									   << "failed to link, even though it should link successfully."
									   << tcu::TestLog::EndMessage;

					TCU_FAIL("Program linking failed, even though the shader combination was valid");
				}

				gl.useProgram(m_po_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed.");
			}

			/* Render a single point */
			gl.enable(GL_RASTERIZER_DISCARD);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) failed");

			gl.beginTransformFeedback(test.tf_mode);

			bool didBeginXFBFail = false;
			if (!test.should_draw_call_fail)
			{
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback(GL_POINTS) failed");
			}
			else
			{
				/* For the negative case, i.e. beginTransformFeedback with an invalid pipeline of {VS, TCS, FS},
				 * ES spec is not clear if beginTransformFeedback should error, so relax the requirment here so
				 * that test passes as long as either beginTransformFeedback or the next draw call raises
				 * INVALID_OPERATION */
				glw::GLint err = gl.getError();
				if (err == GL_INVALID_OPERATION)
				{
					didBeginXFBFail = true;
				}
				else if (err != GL_NO_ERROR)
				{
					TCU_FAIL("Unexpected GL error in a beginTransformFeedback made on the program pipeline whose"
							 "program closest to TFB has no output varying specified");
				}
			}

			{
				gl.drawArrays(m_glExtTokens.PATCHES, 0 /* first */, 1 /* count */);

				if (!test.should_draw_call_fail)
				{
					GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed");
				}
				else
				{
					if (gl.getError() != GL_INVALID_OPERATION)
					{
						TCU_FAIL("A draw call made using a program object lacking TES stage has"
								 " not generated a GL_INVALID_OPERATION as specified");
					}
				}
			}
			gl.endTransformFeedback();

			if (!didBeginXFBFail)
			{
				GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() failed");
			}
			else
			{
				if (gl.getError() != GL_INVALID_OPERATION)
				{
					TCU_FAIL("An endTransformFeedback made on inactive xfb has not generated a "
							 "GL_INVALID_OPERATION as specified");
				}
			}

			gl.disable(GL_RASTERIZER_DISCARD);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable(GL_RASTERIZER_DISCARD) failed");

			if (!test.should_draw_call_fail)
			{
				/* Retrieve the captured result values */
				glw::GLfloat* result_ptr = (glw::GLfloat*)gl.mapBufferRange(
					GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
					sizeof(float) * 4 /* components */ * test.expected_n_values, GL_MAP_READ_BIT | GL_MAP_WRITE_BIT);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() failed");

				/* Verify the data */
				const glw::GLfloat epsilon			  = (glw::GLfloat)1e-5;
				const glw::GLfloat expected_gs_data[] = { 1.0f, 2.0f, 3.0f, 4.0f };
				const glw::GLfloat expected_tc_data[] = { 2.0f, 3.0f, 4.0f, 5.0f };
				const glw::GLfloat expected_te_data[] = { 3.0f, 4.0f, 5.0f, 6.0f };
				const glw::GLfloat expected_vs_data[] = { 4.0f, 5.0f, 6.0f, 7.0f };

				for (int n_value = 0; n_value < test.expected_n_values; ++n_value)
				{
					const glw::GLfloat* expected_data_ptr = NULL;
					const glw::GLfloat* captured_data_ptr = result_ptr + n_value * 4 /* components */;

					if (test.expected_data_source == m_glExtTokens.GEOMETRY_SHADER)
					{
						expected_data_ptr = expected_gs_data;
					}
					else if (test.expected_data_source == m_glExtTokens.TESS_CONTROL_SHADER)
					{
						expected_data_ptr = expected_tc_data;
					}
					else if (test.expected_data_source == m_glExtTokens.TESS_EVALUATION_SHADER)
					{
						expected_data_ptr = expected_te_data;
					}
					else if (test.expected_data_source == GL_VERTEX_SHADER)
					{
						expected_data_ptr = expected_vs_data;
					}
					else
					{
						TCU_FAIL("Unrecognized expected data source");
					}

					if (de::abs(captured_data_ptr[0] - expected_data_ptr[0]) > epsilon ||
						de::abs(captured_data_ptr[1] - expected_data_ptr[1]) > epsilon ||
						de::abs(captured_data_ptr[2] - expected_data_ptr[2]) > epsilon ||
						de::abs(captured_data_ptr[3] - expected_data_ptr[3]) > epsilon)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Captured data "
										   << "(" << captured_data_ptr[0] << ", " << captured_data_ptr[1] << ", "
										   << captured_data_ptr[2] << ", " << captured_data_ptr[3] << ")"
										   << "is different from the expected value "
										   << "(" << expected_data_ptr[0] << ", " << expected_data_ptr[1] << ", "
										   << expected_data_ptr[2] << ", " << expected_data_ptr[3] << ")"
										   << tcu::TestLog::EndMessage;

						TCU_FAIL("Invalid data captured");
					}
				}

				/* Unmap the buffer object, since we're done */
				memset(result_ptr, 0, sizeof(float) * 4 /* components */ * test.expected_n_values);

				gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() failed");
			} /* if (!test.should_draw_call_fail) */

			if (!use_pipeline_object)
			{
				/* Detach all shaders we attached to the program object at the beginning
				 * of the iteration */
				if (test.use_gs)
				{
					gl.detachShader(m_po_id, m_gs_id);
					GLU_EXPECT_NO_ERROR(gl.getError(), "Could not detach geometry shader");
				}

				if (test.use_tc)
				{
					gl.detachShader(m_po_id, m_tc_id);
					GLU_EXPECT_NO_ERROR(gl.getError(), "Could not detach tessellation control shader");
				}

				if (test.use_te)
				{
					gl.detachShader(m_po_id, m_te_id);
					GLU_EXPECT_NO_ERROR(gl.getError(), "Could not detach tessellation evaluation shader");
				}

			} /* if (!use_pipeline_object) */
			else
			{
				/* We don't need to do anything with the pipeline object - stages will be
				 * re-defined in next iteration */
			}
		} /* for (all tests) */
	}	 /* for (all iterations) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}